

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O0

void __thiscall SceneRender::render(SceneRender *this,Uniforms *_uniforms)

{
  Fbo *_fbo;
  size_t _texLoc;
  unsigned_long uVar1;
  Uniforms *pUVar2;
  bool bVar3;
  int iVar4;
  mat4 *pmVar5;
  Tracker *pTVar6;
  pointer ppVar7;
  Shader *pSVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  vec3 *v1;
  vec3 *v2;
  size_type sVar9;
  reference ppFVar10;
  Shader *pSVar11;
  string *psVar12;
  vec<3,_float,_(glm::qualifier)0> vVar13;
  allocator local_2a9;
  string local_2a8;
  allocator local_281;
  string local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  string local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  unsigned_long local_200;
  size_t i;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_1f0;
  vec3 local_1e8;
  allocator local_1d9;
  string local_1d8;
  mat<4,_4,_float,_(glm::qualifier)0> local_1b4;
  allocator local_171;
  string local_170;
  mat<4,_4,_float,_(glm::qualifier)0> local_14c;
  mat<4,_4,_float,_(glm::qualifier)0> local_10c;
  allocator local_c9;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  _Self local_88;
  _Self local_80;
  iterator it;
  string local_70;
  allocator local_39;
  string local_38;
  Uniforms *local_18;
  Uniforms *_uniforms_local;
  SceneRender *this_local;
  
  local_18 = _uniforms;
  _uniforms_local = (Uniforms *)this;
  renderBackground(this,_uniforms);
  if ((this->m_depth_test & 1U) != 0) {
    glEnable(0xb71);
  }
  vera::blendMode(this->m_blend);
  if ((((((local_18->super_Scene).activeCamera)->super_Node).bChange & 1U) != 0) ||
     (((this->m_origin).bChange & 1U) != 0)) {
    vera::setCamera((local_18->super_Scene).activeCamera);
    pmVar5 = vera::Node::getTransformMatrix(&this->m_origin);
    vera::applyMatrix(pmVar5);
  }
  bVar3 = Tracker::isRunning(&local_18->tracker);
  if (bVar3) {
    pTVar6 = &local_18->tracker;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"render:scene:floor",&local_39);
    Tracker::begin(pTVar6,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  renderFloor(this,local_18);
  bVar3 = Tracker::isRunning(&local_18->tracker);
  if (bVar3) {
    pTVar6 = &local_18->tracker;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_70,"render:scene:floor",(allocator *)((long)&it._M_node + 7));
    Tracker::end(pTVar6,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_node + 7));
  }
  vera::cullingMode(this->m_culling);
  local_80._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>_>
       ::begin(&(local_18->super_Scene).models);
  while( true ) {
    local_88._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>_>
         ::end(&(local_18->super_Scene).models);
    bVar3 = std::operator!=(&local_80,&local_88);
    if (!bVar3) break;
    bVar3 = Tracker::isRunning(&local_18->tracker);
    if (bVar3) {
      pTVar6 = &local_18->tracker;
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
               ::operator->(&local_80);
      psVar12 = vera::Model::getName_abi_cxx11_(ppVar7->second);
      std::operator+(&local_a8,"render:scene:",psVar12);
      Tracker::begin(pTVar6,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
    }
    ppVar7 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
             ::operator->(&local_80);
    pSVar8 = vera::Model::getShader(ppVar7->second);
    vera::Shader::use(pSVar8);
    pUVar2 = local_18;
    ppVar7 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
             ::operator->(&local_80);
    pSVar8 = vera::Model::getShader(ppVar7->second);
    (*(pUVar2->super_Scene)._vptr_Scene[0x3e])(pUVar2,pSVar8,1);
    ppVar7 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
             ::operator->(&local_80);
    pSVar8 = vera::Model::getShader(ppVar7->second);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c8,"u_modelViewProjectionMatrix",&local_c9);
    vera::getProjectionViewWorldMatrix();
    ppVar7 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
             ::operator->(&local_80);
    iVar4 = (*(ppVar7->second->super_Node)._vptr_Node[0x20])();
    glm::operator*(&local_10c,&local_14c,
                   (mat<4,_4,_float,_(glm::qualifier)0> *)CONCAT44(extraout_var,iVar4));
    vera::Shader::setUniform(pSVar8,&local_c8,&local_10c,false);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    ppVar7 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
             ::operator->(&local_80);
    pSVar8 = vera::Model::getShader(ppVar7->second);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_170,"u_modelMatrix",&local_171);
    pmVar5 = vera::Node::getTransformMatrix(&this->m_origin);
    ppVar7 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
             ::operator->(&local_80);
    iVar4 = (*(ppVar7->second->super_Node)._vptr_Node[0x20])();
    glm::operator*(&local_1b4,pmVar5,
                   (mat<4,_4,_float,_(glm::qualifier)0> *)CONCAT44(extraout_var_00,iVar4));
    vera::Shader::setUniform(pSVar8,&local_170,&local_1b4,false);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator((allocator<char> *)&local_171);
    ppVar7 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
             ::operator->(&local_80);
    pSVar8 = vera::Model::getShader(ppVar7->second);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1d8,"u_model",&local_1d9);
    v1 = vera::Node::getPosition(&this->m_origin);
    v2 = vera::Node::getPosition(&(this->m_floor).super_Node);
    vVar13 = glm::operator+(v1,v2);
    local_1f0 = vVar13.field_2;
    i = vVar13._0_8_;
    local_1e8._0_8_ = i;
    local_1e8.field_2 = local_1f0;
    vera::Shader::setUniform(pSVar8,&local_1d8,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
    for (local_200 = 0; uVar1 = local_200,
        sVar9 = std::vector<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>::size(&this->buffersFbo),
        uVar1 < sVar9; local_200 = local_200 + 1) {
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
               ::operator->(&local_80);
      pSVar8 = vera::Model::getShader(ppVar7->second);
      vera::toString<unsigned_long>(&local_240,&local_200);
      std::operator+(&local_220,"u_sceneBuffer",&local_240);
      ppFVar10 = std::vector<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>::operator[]
                           (&this->buffersFbo,local_200);
      _fbo = *ppFVar10;
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
               ::operator->(&local_80);
      pSVar11 = vera::Model::getShader(ppVar7->second);
      _texLoc = pSVar11->textureIndex;
      pSVar11->textureIndex = _texLoc + 1;
      vera::Shader::setUniformTexture(pSVar8,&local_220,_fbo,_texLoc);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_240);
    }
    ppVar7 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
             ::operator->(&local_80);
    vera::Model::render(ppVar7->second);
    bVar3 = Tracker::isRunning(&local_18->tracker);
    if (bVar3) {
      pTVar6 = &local_18->tracker;
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
               ::operator->(&local_80);
      psVar12 = vera::Model::getName_abi_cxx11_(ppVar7->second);
      std::operator+(&local_260,"render:scene:",psVar12);
      Tracker::end(pTVar6,&local_260);
      std::__cxx11::string::~string((string *)&local_260);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>
    ::operator++(&local_80);
  }
  bVar3 = Tracker::isRunning(&local_18->tracker);
  if (bVar3) {
    pTVar6 = &local_18->tracker;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_280,"render:scene:devlook",&local_281);
    Tracker::begin(pTVar6,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::allocator<char>::~allocator((allocator<char> *)&local_281);
  }
  renderDevLook(this,local_18);
  bVar3 = Tracker::isRunning(&local_18->tracker);
  if (bVar3) {
    pTVar6 = &local_18->tracker;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2a8,"render:scene:devlook",&local_2a9);
    Tracker::end(pTVar6,&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  }
  if ((this->m_depth_test & 1U) != 0) {
    glDisable(0xb71);
  }
  if (this->m_blend != BLEND_NONE) {
    vera::blendMode(BLEND_ALPHA);
  }
  if (this->m_culling != CULL_NONE) {
    glDisable(0xb44);
  }
  return;
}

Assistant:

void SceneRender::render(Uniforms& _uniforms) {
    // Render Background
    renderBackground(_uniforms);

    // Begining of DEPTH for 3D 
    if (m_depth_test)
        glEnable(GL_DEPTH_TEST);

    vera::blendMode(m_blend);

    if (_uniforms.activeCamera->bChange || m_origin.bChange) {
        vera::setCamera( _uniforms.activeCamera );
        vera::applyMatrix( m_origin.getTransformMatrix() );
    }

    TRACK_BEGIN("render:scene:floor")
    renderFloor(_uniforms );
    TRACK_END("render:scene:floor")

    vera::cullingMode(m_culling);

    for (vera::ModelsMap::iterator it = _uniforms.models.begin(); it != _uniforms.models.end(); ++it) {
        TRACK_BEGIN("render:scene:" + it->second->getName() )

        // bind the shader
        it->second->getShader()->use();

        // Update Uniforms and textures variables to the shader
        _uniforms.feedTo( it->second->getShader(), true, true );

        // Pass special uniforms
        it->second->getShader()->setUniform( "u_modelViewProjectionMatrix", vera::getProjectionViewWorldMatrix() * it->second->getTransformMatrix() );
        it->second->getShader()->setUniform( "u_modelMatrix", m_origin.getTransformMatrix() * it->second->getTransformMatrix() );
        it->second->getShader()->setUniform( "u_model", m_origin.getPosition() + m_floor.getPosition() );

        for (size_t i = 0; i < buffersFbo.size(); i++)
            it->second->getShader()->setUniformTexture("u_sceneBuffer" + vera::toString(i), buffersFbo[i], it->second->getShader()->textureIndex++);

        it->second->render();

        TRACK_END("render:scene:" + it->second->getName() )
    }

    TRACK_BEGIN("render:scene:devlook")
    renderDevLook(_uniforms);
    TRACK_END("render:scene:devlook")

    if (m_depth_test)
        glDisable(GL_DEPTH_TEST);

    if (m_blend != 0)
        vera::blendMode(vera::BLEND_ALPHA);

    if (m_culling != 0)
        glDisable(GL_CULL_FACE);
}